

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O2

void DrawPolyLines(Vector2 center,int sides,float radius,float rotation,Color color)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  undefined4 local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  
  uVar3 = 3;
  if (3 < sides) {
    uVar3 = (ulong)(uint)sides;
  }
  rlCheckRenderBatchLimit((int)(0x168 / uVar3) * 3);
  rlPushMatrix();
  local_38 = center.x;
  uStack_34 = center.y;
  local_40 = 0.0;
  rlTranslatef(local_38,uStack_34,0.0);
  rlRotatef(rotation,0.0,0.0,1.0);
  rlBegin(1);
  iVar1 = (int)uVar3;
  while (iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), iVar2 != 0) {
    rlColor4ub(color.r,color.g,color.b,color.a);
    fVar4 = sinf(local_40 * 0.017453292);
    fVar5 = cosf(local_40 * 0.017453292);
    rlVertex2f(fVar4 * radius,fVar5 * radius);
    local_40 = local_40 + 360.0 / (float)iVar1;
    fVar4 = sinf(local_40 * 0.017453292);
    fVar5 = cosf(local_40 * 0.017453292);
    rlVertex2f(fVar4 * radius,fVar5 * radius);
  }
  rlEnd();
  rlPopMatrix();
  return;
}

Assistant:

void DrawPolyLines(Vector2 center, int sides, float radius, float rotation, Color color)
{
    if (sides < 3) sides = 3;
    float centralAngle = 0.0f;

    rlCheckRenderBatchLimit(3*(360/sides));

    rlPushMatrix();
        rlTranslatef(center.x, center.y, 0.0f);
        rlRotatef(rotation, 0.0f, 0.0f, 1.0f);

        rlBegin(RL_LINES);
            for (int i = 0; i < sides; i++)
            {
                rlColor4ub(color.r, color.g, color.b, color.a);

                rlVertex2f(sinf(DEG2RAD*centralAngle)*radius, cosf(DEG2RAD*centralAngle)*radius);
                centralAngle += 360.0f/(float)sides;
                rlVertex2f(sinf(DEG2RAD*centralAngle)*radius, cosf(DEG2RAD*centralAngle)*radius);
            }
        rlEnd();
    rlPopMatrix();
}